

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

LoadResult
wallet::LoadRecords(CWallet *pwallet,DatabaseBatch *batch,string *key,DataStream *prefix,
                   LoadFunc *load_func)

{
  long lVar1;
  __type_conflict _Var2;
  int iVar3;
  DBErrors DVar4;
  pointer pbVar5;
  uint uVar6;
  ulong uVar7;
  DBErrors DVar8;
  long in_FS_OFFSET;
  long *local_c0;
  DataStream local_b8;
  DataStream ssKey;
  string error;
  string type;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ssKey.m_read_pos = 0;
  ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_read_pos = 0;
  local_b8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar5 = (prefix->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start + prefix->m_read_pos;
  (*batch->_vptr_DatabaseBatch[10])
            (&local_c0,batch,pbVar5,
             (long)(prefix->vch).
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pbVar5);
  if (local_c0 == (long *)0x0) {
    CWallet::WalletLogPrintf<std::__cxx11::string>(pwallet,(ConstevalFormatString<1U>)0xe0b0ef,key);
    uVar6 = 0;
  }
  else {
    DVar8 = LOAD_OK;
    uVar6 = 0;
    while( true ) {
      iVar3 = (**(code **)(*local_c0 + 0x10))(local_c0,&ssKey,&local_b8);
      if (iVar3 == 0) break;
      if (iVar3 == 2) {
        uVar7 = (ulong)DVar8;
        goto LAB_009bb947;
      }
      type._M_dataplus._M_p = (pointer)&type.field_2;
      type._M_string_length = 0;
      type.field_2._M_local_buf[0] = '\0';
      Unserialize<DataStream,char>(&ssKey,&type);
      _Var2 = std::operator==(&type,key);
      if (!_Var2) {
        __assert_fail("type == key",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp"
                      ,0x209,
                      "LoadResult wallet::LoadRecords(CWallet *, DatabaseBatch &, const std::string &, DataStream &, LoadFunc)"
                     );
      }
      error._M_dataplus._M_p = (pointer)&error.field_2;
      error._M_string_length = 0;
      error.field_2._M_local_buf[0] = '\0';
      DVar4 = std::
              function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(load_func,pwallet,&ssKey,&local_b8,&error);
      if (DVar4 != LOAD_OK) {
        CWallet::WalletLogPrintf<std::__cxx11::string>
                  (pwallet,(ConstevalFormatString<1U>)0xe4f3f8,&error);
      }
      if ((int)DVar8 <= (int)DVar4) {
        DVar8 = DVar4;
      }
      uVar6 = uVar6 + 1;
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::string::~string((string *)&type);
    }
    CWallet::WalletLogPrintf<std::__cxx11::string>(pwallet,(ConstevalFormatString<1U>)0xe0b22c,key);
  }
  uVar7 = 9;
LAB_009bb947:
  if (local_c0 != (long *)0x0) {
    (**(code **)(*local_c0 + 8))();
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_b8);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ssKey);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (LoadResult)((ulong)uVar6 << 0x20 | uVar7);
  }
  __stack_chk_fail();
}

Assistant:

static LoadResult LoadRecords(CWallet* pwallet, DatabaseBatch& batch, const std::string& key, DataStream& prefix, LoadFunc load_func)
{
    LoadResult result;
    DataStream ssKey;
    DataStream ssValue{};

    Assume(!prefix.empty());
    std::unique_ptr<DatabaseCursor> cursor = batch.GetNewPrefixCursor(prefix);
    if (!cursor) {
        pwallet->WalletLogPrintf("Error getting database cursor for '%s' records\n", key);
        result.m_result = DBErrors::CORRUPT;
        return result;
    }

    while (true) {
        DatabaseCursor::Status status = cursor->Next(ssKey, ssValue);
        if (status == DatabaseCursor::Status::DONE) {
            break;
        } else if (status == DatabaseCursor::Status::FAIL) {
            pwallet->WalletLogPrintf("Error reading next '%s' record for wallet database\n", key);
            result.m_result = DBErrors::CORRUPT;
            return result;
        }
        std::string type;
        ssKey >> type;
        assert(type == key);
        std::string error;
        DBErrors record_res = load_func(pwallet, ssKey, ssValue, error);
        if (record_res != DBErrors::LOAD_OK) {
            pwallet->WalletLogPrintf("%s\n", error);
        }
        result.m_result = std::max(result.m_result, record_res);
        ++result.m_records;
    }
    return result;
}